

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O3

void ly_free_prefix_data(LY_VALUE_FORMAT format,void *prefix_data)

{
  undefined8 *puVar1;
  ulong uVar2;
  
  if (prefix_data != (void *)0x0) {
    if ((format == LY_VALUE_STR_NS) || (format == LY_VALUE_XML)) {
      if (*(int *)((long)prefix_data + 4) != 0) {
        uVar2 = 0;
        do {
          free((void *)**(undefined8 **)(*(long *)((long)prefix_data + 8) + uVar2 * 8));
          free(*(void **)(*(long *)(*(long *)((long)prefix_data + 8) + uVar2 * 8) + 8));
          uVar2 = uVar2 + 1;
        } while (uVar2 < *(uint *)((long)prefix_data + 4));
      }
      ly_set_free((ly_set *)prefix_data,free);
      return;
    }
    if (format == LY_VALUE_SCHEMA_RESOLVED) {
      if (*(long *)((long)prefix_data + -8) != 0) {
        uVar2 = 0;
        puVar1 = (undefined8 *)prefix_data;
        do {
          free((void *)*puVar1);
          uVar2 = uVar2 + 1;
          puVar1 = puVar1 + 2;
        } while (uVar2 < *(ulong *)((long)prefix_data + -8));
      }
      free((void *)((long)prefix_data + -8));
      return;
    }
  }
  return;
}

Assistant:

void
ly_free_prefix_data(LY_VALUE_FORMAT format, void *prefix_data)
{
    struct ly_set *ns_list;
    struct lysc_prefix *prefixes;
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u;

    if (!prefix_data) {
        return;
    }

    switch (format) {
    case LY_VALUE_XML:
    case LY_VALUE_STR_NS:
        ns_list = prefix_data;
        for (i = 0; i < ns_list->count; ++i) {
            free(((struct lyxml_ns *)ns_list->objs[i])->prefix);
            free(((struct lyxml_ns *)ns_list->objs[i])->uri);
        }
        ly_set_free(ns_list, free);
        break;
    case LY_VALUE_SCHEMA_RESOLVED:
        prefixes = prefix_data;
        LY_ARRAY_FOR(prefixes, u) {
            free(prefixes[u].prefix);
        }
        LY_ARRAY_FREE(prefixes);
        break;
    case LY_VALUE_CANON:
    case LY_VALUE_SCHEMA:
    case LY_VALUE_JSON:
    case LY_VALUE_LYB:
        break;
    }
}